

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O0

int csp_id_setup_rx(csp_packet_t *packet)

{
  csp_packet_t *in_RDI;
  undefined4 local_4;
  
  if (csp_conf.version == '\x02') {
    csp_id2_setup_rx(in_RDI);
    local_4 = 6;
  }
  else {
    csp_id1_setup_rx(in_RDI);
    local_4 = 4;
  }
  return local_4;
}

Assistant:

int csp_id_setup_rx(csp_packet_t * packet) {
	if (csp_conf.version == 2) {
		csp_id2_setup_rx(packet);
		return CSP_ID2_HEADER_SIZE;
	} else {
		csp_id1_setup_rx(packet);
		return CSP_ID1_HEADER_SIZE;
	}
}